

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O1

bool TldAddressAsKey::CompareByAddressAndTld(TldAddressAsKey *x,TldAddressAsKey *y)

{
  size_t __n;
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  ulong __n_00;
  bool bVar5;
  
  __n = x->addr_len;
  uVar1 = y->addr_len;
  bVar5 = uVar1 < __n;
  if (__n == uVar1) {
    iVar4 = memcmp(x->addr,y->addr,__n);
    if (iVar4 < 1) {
      if (iVar4 == 0) {
        uVar2 = x->tld_len;
        uVar3 = y->tld_len;
        __n_00 = uVar2;
        if (uVar3 < uVar2) {
          __n_00 = uVar3;
        }
        iVar4 = memcmp(x->tld,y->tld,__n_00);
        bVar5 = true;
        if (iVar4 < 1) {
          bVar5 = uVar1 < __n;
          if (iVar4 == 0) {
            bVar5 = uVar3 < uVar2;
          }
        }
      }
    }
    else {
      bVar5 = true;
    }
  }
  return bVar5;
}

Assistant:

bool TldAddressAsKey::CompareByAddressAndTld(TldAddressAsKey * x, TldAddressAsKey * y)
{
    bool ret = x->addr_len > y->addr_len;

    if (x->addr_len == y->addr_len)
    {
        int r = memcmp(x->addr, y->addr, x->addr_len);

        if (r > 0) {
            ret = true;
        }
        else if (r == 0) {
            size_t tld_len = x->tld_len;
            if (y->tld_len < x->tld_len) {
                tld_len = y->tld_len;
            }
            r = memcmp(x->tld, y->tld, tld_len);
            if (r > 0) {
                ret = true;
            }
            else if (r == 0) {
                ret = x->tld_len > y->tld_len;
            }
        }
    }

    return ret;
}